

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ler.c
# Opt level: O2

int errfmt(char *outbuf,int outbufl,char *fmt,int argc,erradef *argv)

{
  char cVar1;
  uint uVar2;
  size_t sVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  uint uVar7;
  int iVar8;
  char *pcVar9;
  uint uVar10;
  char *local_70;
  char *local_60;
  char buf [20];
  
  uVar6 = (ulong)(uint)outbufl;
  uVar2 = 1;
  iVar8 = 0;
  iVar4 = 0;
  local_70 = outbuf;
  do {
    cVar1 = *fmt;
    iVar5 = (int)uVar6;
    if ((cVar1 == '\0') || (iVar5 < 2)) {
      if (iVar5 != 0) {
        *local_70 = '\0';
      }
      return iVar8;
    }
    uVar7 = uVar2;
    if (cVar1 == '%') {
      uVar10 = (int)fmt[1];
      if (argc <= iVar4) {
        uVar10 = uVar2;
      }
      if (uVar10 == 0) {
LAB_00129af2:
        iVar4 = iVar4 + 1;
      }
      else {
        fmt = fmt + 1;
        if (uVar10 == 0x75) {
          uVar7 = argv[iVar4].erraint;
          pcVar9 = "%u";
LAB_00129ab4:
          local_60 = buf;
          sprintf(buf,pcVar9,(ulong)uVar7);
        }
        else {
          if (uVar10 == 100) {
            uVar7 = argv[iVar4].erraint;
            pcVar9 = "%d";
            goto LAB_00129ab4;
          }
          if (uVar10 != 0x73) {
            if (uVar10 == 0x25) {
              iVar4 = iVar4 + 1;
              pcVar9 = "%";
              goto LAB_001299a2;
            }
            iVar4 = iVar4 + -1;
            local_60 = "";
            goto LAB_00129af2;
          }
          local_60 = argv[iVar4].errastr;
        }
        sVar3 = strlen(local_60);
        iVar4 = iVar4 + 1;
        pcVar9 = local_60;
        uVar7 = (uint)sVar3;
        if ((uint)sVar3 != 0) goto LAB_001299a2;
      }
    }
    else {
      pcVar9 = fmt;
      if ((cVar1 == '\\') && (cVar1 = fmt[1], pcVar9 = local_60, cVar1 != '\0')) {
        fmt = fmt + 1;
        if (cVar1 == '\t') {
          pcVar9 = "\t";
        }
        else {
          pcVar9 = fmt;
          if (cVar1 == '\n') {
            pcVar9 = "\n";
          }
        }
      }
LAB_001299a2:
      uVar10 = iVar5 - uVar7;
      if (iVar5 < (int)uVar7) {
        memcpy(local_70,pcVar9,uVar6 - 1);
        uVar10 = uVar2;
      }
      else {
        memcpy(local_70,pcVar9,(long)(int)uVar7);
        local_70 = local_70 + (int)uVar7;
      }
      iVar8 = uVar7 + iVar8;
      uVar6 = (ulong)uVar10;
      local_60 = pcVar9;
    }
    fmt = fmt + 1;
  } while( true );
}

Assistant:

int errfmt(char *outbuf, int outbufl, char *fmt, int argc, erradef *argv)
{
    int    outlen = 0;
    int    argi   = 0;
    int    len;
    char   buf[20];
    char  *p;
    char   fmtchar;

    while (*fmt != '\0' && outbufl > 1)
    {
        switch(*fmt)
        {
        case '\\':
            ++fmt;
            len = 1;
            switch(*fmt)
            {
            case '\0':
                --fmt;
                break;
            case '\n':
                p = "\n";
                break;
            case '\t':
                p = "\t";
                break;
            default:
                p = fmt;
                break;
            }
            break;
            
        case '%':
            ++fmt;
            fmtchar = *fmt;
            if (argi >= argc) fmtchar = 1;          /* too many - ignore it */
            switch(fmtchar)
            {
            case '\0':
                --fmt;
                len = 0;
                break;
                
            case '%':
                p = "%";
                len = 1;
                break;
                
            case 'd':
                sprintf(buf, "%d", argv[argi].erraint);
                len = strlen(buf);
                p = buf;
                break;
                
            case 'u':
                sprintf(buf, "%u", argv[argi].erraint);
                len = strlen(buf);
                p = buf;
                break;
                
            case 's':
                p = argv[argi].errastr;
                len = strlen(p);
                break;
                
            default:
                p = "";
                len = 0;
                --argi;
                break;
            }
            ++argi;
            break;
            
        default:
            p = fmt;
            len = 1;
            break;
        }

        /* copy output that was set up above */
        if (len != 0)
        {
            if (outbufl >= len)
            {
                memcpy(outbuf, p, (size_t)len);
                outbufl -= len;
                outbuf += len;
            }
            else if (outbufl > 1)
            {
                memcpy(outbuf, p, (size_t)outbufl - 1);
                outbufl = 1;
            }
            outlen += len;
        }
        ++fmt;
    }

    /* add a null terminator */
    if (outbufl != 0)
        *outbuf++ = '\0';

    /* return the length */
    return outlen;
}